

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_3_4::RgbaYca::roundYCA(int n,uint roundY,uint roundC,Rgba *ycaIn,Rgba *ycaOut)

{
  undefined2 extraout_AX;
  undefined2 extraout_AX_00;
  undefined2 extraout_AX_01;
  long in_RCX;
  int in_EDI;
  long in_R8;
  double in_XMM0_Qa;
  double __x;
  int i;
  undefined4 local_24;
  
  for (local_24 = 0; (int)local_24 < in_EDI; local_24 = local_24 + 1) {
    in_XMM0_Qa = Imath_3_2::half::round((half *)(in_RCX + (long)(int)local_24 * 8 + 2),in_XMM0_Qa);
    *(undefined2 *)(in_R8 + 2 + (long)(int)local_24 * 8) = extraout_AX;
    *(undefined2 *)(in_R8 + 6 + (long)(int)local_24 * 8) =
         *(undefined2 *)(in_RCX + 6 + (long)(int)local_24 * 8);
    if ((local_24 & 1) == 0) {
      __x = Imath_3_2::half::round((half *)(in_RCX + (long)(int)local_24 * 8),in_XMM0_Qa);
      *(undefined2 *)(in_R8 + (long)(int)local_24 * 8) = extraout_AX_00;
      in_XMM0_Qa = Imath_3_2::half::round((half *)(in_RCX + (long)(int)local_24 * 8 + 4),__x);
      *(undefined2 *)(in_R8 + 4 + (long)(int)local_24 * 8) = extraout_AX_01;
    }
  }
  return;
}

Assistant:

void
roundYCA (
    int          n,
    unsigned int roundY,
    unsigned int roundC,
    const Rgba   ycaIn[/*n*/],
    Rgba         ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        ycaOut[i].g = ycaIn[i].g.round (roundY);
        ycaOut[i].a = ycaIn[i].a;

        if ((i & 1) == 0)
        {
            ycaOut[i].r = ycaIn[i].r.round (roundC);
            ycaOut[i].b = ycaIn[i].b.round (roundC);
        }
    }
}